

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

void __thiscall doctest::anon_unknown_14::ConsoleReporter::log_contexts(ConsoleReporter *this)

{
  long *plVar1;
  ostream *s;
  long lVar2;
  char *pcVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  long *in_FS_OFFSET;
  
  detail::g_infoContexts::__tls_init();
  lVar4 = *in_FS_OFFSET;
  plVar1 = (long *)(lVar4 + -0x30);
  uVar6 = (uint)((ulong)(*(long *)(lVar4 + -0x28) - *plVar1) >> 3);
  if (uVar6 != 0) {
    detail::g_infoContexts::__tls_init();
    if ((int)((ulong)(*(long *)(lVar4 + -0x28) - *plVar1) >> 3) == 0) {
      lVar4 = 0;
    }
    else {
      detail::g_infoContexts::__tls_init();
      lVar4 = *plVar1;
    }
    s = this->s;
    Color::operator<<(s,None);
    std::__ostream_insert<char,std::char_traits<char>>(s,"  logged: ",10);
    if (0 < (int)uVar6) {
      uVar5 = 0;
      do {
        pcVar3 = "          ";
        if (uVar5 == 0) {
          pcVar3 = "";
        }
        lVar2 = 10;
        if (uVar5 == 0) {
          lVar2 = 0;
        }
        std::__ostream_insert<char,std::char_traits<char>>(this->s,pcVar3,lVar2);
        plVar1 = *(long **)(lVar4 + uVar5 * 8);
        (**(code **)(*plVar1 + 0x10))(plVar1,this->s);
        std::__ostream_insert<char,std::char_traits<char>>(this->s,"\n",1);
        uVar5 = uVar5 + 1;
      } while ((uVar6 & 0x7fffffff) != uVar5);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(this->s,"\n",1);
  return;
}

Assistant:

void log_contexts() {
            int num_contexts = get_num_active_contexts();
            if(num_contexts) {
                auto contexts = get_active_contexts();

                s << Color::None << "  logged: ";
                for(int i = 0; i < num_contexts; ++i) {
                    s << (i == 0 ? "" : "          ");
                    contexts[i]->stringify(&s);
                    s << "\n";
                }
            }

            s << "\n";
        }